

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

Vec_Int_t * Tas_ManSolveMiterNc(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  Vec_Int_t *vCex;
  int iVar1;
  abctime aVar2;
  Tas_Man_t *p;
  Vec_Str_t *p_00;
  Vec_Int_t *vCexStore;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  abctime aVar5;
  int v;
  bool bVar6;
  
  aVar2 = Abc_Clock();
  if (pAig->nRegs == 0) {
    Gia_ManCreateRefs(pAig);
    Gia_ManCleanMark0(pAig);
    Gia_ManCleanMark1(pAig);
    Gia_ManFillValue(pAig);
    Gia_ManCleanPhase(pAig);
    p = Tas_ManAlloc(pAig,nConfs);
    p->pAig = pAig;
    p_00 = Vec_StrAlloc(pAig->vCos->nSize - pAig->nRegs);
    vCexStore = Vec_IntAlloc(10000);
    p_01 = Vec_IntAlloc(100);
    vCex = p->vModel;
    v = 0;
    while ((v < pAig->vCos->nSize && (pGVar3 = Gia_ManCo(pAig,v), pGVar3 != (Gia_Obj_t *)0x0))) {
      vCex->nSize = 0;
      if ((~*(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) &
          0x1fffffff1fffffff) == 0) {
        bVar6 = ((uint)*(undefined8 *)pGVar3 >> 0x1d & 1) != 0;
        if (bVar6) {
          Cec_ManSatAddToStore(vCexStore,vCex,v);
        }
        Vec_StrPush(p_00,!bVar6);
      }
      else {
        aVar4 = Abc_Clock();
        (p->Pars).fUseHighest = 1;
        (p->Pars).fUseLowest = 0;
        iVar1 = Tas_ManSolve(p,(Gia_Obj_t *)
                               ((ulong)((uint)*(undefined8 *)pGVar3 >> 0x1d & 1) ^
                               (ulong)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)))
                             ,(Gia_Obj_t *)0x0);
        Vec_StrPush(p_00,(char)iVar1);
        if (iVar1 == 1) {
          p->nSatUnsat = p->nSatUnsat + 1;
          p->nConfUnsat = p->nConfUnsat + (p->Pars).nBTThis;
          aVar5 = Abc_Clock();
          p->timeSatUnsat = p->timeSatUnsat + (aVar5 - aVar4);
        }
        else if (iVar1 == -1) {
          p->nSatUndec = p->nSatUndec + 1;
          p->nConfUndec = p->nConfUndec + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(vCexStore,(Vec_Int_t *)0x0,v);
          aVar5 = Abc_Clock();
          p->timeSatUndec = p->timeSatUndec + (aVar5 - aVar4);
        }
        else {
          p->nSatSat = p->nSatSat + 1;
          p->nConfSat = p->nConfSat + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(vCexStore,vCex,v);
          aVar5 = Abc_Clock();
          p->timeSatSat = p->timeSatSat + (aVar5 - aVar4);
        }
      }
      v = v + 1;
    }
    Vec_IntFree(p_01);
    p->nSatTotal = pAig->vCos->nSize - pAig->nRegs;
    aVar4 = Abc_Clock();
    p->timeTotal = aVar4 - aVar2;
    if (fVerbose != 0) {
      Tas_ManSatPrintStats(p);
    }
    Tas_ManStop(p);
    *pvStatus = p_00;
    return vCexStore;
  }
  __assert_fail("Gia_ManRegNum(pAig) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                ,0x5f9,"Vec_Int_t *Tas_ManSolveMiterNc(Gia_Man_t *, int, Vec_Str_t **, int)");
}

Assistant:

Vec_Int_t * Tas_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Gia_ManCollectTest( Gia_Man_t * pAig );
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Tas_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot;//, * pRootCopy; 
//    Gia_Man_t * pAigCopy = Gia_ManDup( pAig ), * pAigTemp;

    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
//    Gia_ManCollectTest( pAig );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    Gia_ManCleanMark0( pAig );
    Gia_ManCleanMark1( pAig );
    Gia_ManFillValue( pAig ); // maps nodes into trail ids
    Gia_ManCleanPhase( pAig ); // maps nodes into trail ids
    // create logic network
    p = Tas_ManAlloc( pAig, nConfs );
    p->pAig   = pAig;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Tas_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
//        printf( "%d=", i );

        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
//                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        } 
        clk = Abc_Clock();
//        p->Pars.fUseActive  = 1;
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;
        status = Tas_ManSolve( p, Gia_ObjChild0(pRoot), NULL );
//        printf( "\n" );
/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Tas_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
//            printf( "Unsolved %d.\n", i );

            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }

//        pRootCopy = Gia_ManCo( pAigCopy, i );
//        pRootCopy->iDiff0 = Gia_ObjId( pAigCopy, pRootCopy );
//        pRootCopy->fCompl0 = 0;

        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;

//        printf( "%d ", Vec_IntSize(vCex) );
    }
//    pAigCopy = Gia_ManCleanup( pAigTemp = pAigCopy );
//    Gia_ManStop( pAigTemp );
//    Gia_DumpAiger( pAigCopy, "test", 0, 2 );
//    Gia_ManStop( pAigCopy );

    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Tas_ManSatPrintStats( p );
//    printf( "RecCalls = %8d.  RecClause = %8d.  RecNonChro = %8d.\n", p->nRecCall, p->nRecClause, p->nRecNonChro );
    Tas_ManStop( p );
    *pvStatus = vStatus;

//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}